

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

float mpack_expect_float(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  float fVar2;
  mpack_tag_t mVar3;
  
  mVar3 = mpack_read_tag(reader);
  aVar1 = mVar3.v;
  fVar2 = mVar3.v._0_4_;
  switch(mVar3.type) {
  case mpack_type_uint:
    if (aVar1.i < 0) {
      fVar2 = (float)((ulong)((uint)fVar2 & 1) | aVar1.u >> 1);
      return fVar2 + fVar2;
    }
  case mpack_type_int:
    fVar2 = (float)aVar1.i;
    break;
  case mpack_type_float:
    break;
  case mpack_type_double:
    fVar2 = (float)aVar1.d;
    break;
  default:
    fVar2 = 0.0;
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
        fVar2 = 0.0;
      }
    }
  }
  return fVar2;
}

Assistant:

float mpack_expect_float(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint)
        return (float)var.v.u;
    else if (var.type == mpack_type_int)
        return (float)var.v.i;
    else if (var.type == mpack_type_float)
        return var.v.f;
    else if (var.type == mpack_type_double)
        return (float)var.v.d;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0f;
}